

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter(Normalizer2Impl *this,UChar32 c,UBool onlyContiguous)

{
  UBool UVar1;
  uint16_t norm16;
  UBool onlyContiguous_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  norm16 = getNorm16(this,c);
  UVar1 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
  return UVar1;
}

Assistant:

UBool hasCompBoundaryAfter(UChar32 c, UBool onlyContiguous) const {
        return norm16HasCompBoundaryAfter(getNorm16(c), onlyContiguous);
    }